

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<char> * __thiscall
cimg_library::CImg<char>::set_vector_at<char>(CImg<char> *this,CImg<char> *vec,uint x,uint y,uint z)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  
  uVar4 = this->_width;
  if (((x < uVar4) && (y < this->_height)) && (uVar1 = this->_depth, z < uVar1)) {
    pcVar2 = vec->_data;
    lVar6 = (ulong)this->_height * (ulong)uVar4;
    pcVar3 = this->_data + (ulong)z * lVar6 + (ulong)y * (ulong)uVar4 + (ulong)x;
    uVar4 = vec->_height * vec->_width * vec->_depth * vec->_spectrum;
    if (this->_spectrum < uVar4) {
      uVar4 = this->_spectrum;
    }
    for (lVar5 = 0; uVar4 != (uint)lVar5; lVar5 = lVar5 + 1) {
      *pcVar3 = pcVar2[lVar5];
      pcVar3 = pcVar3 + (ulong)uVar1 * lVar6;
    }
  }
  return this;
}

Assistant:

CImg<T>& set_vector_at(const CImg<t>& vec, const unsigned int x, const unsigned int y=0, const unsigned int z=0) {
      if (x<_width && y<_height && z<_depth) {
        const t *ptrs = vec._data;
        const unsigned long whd = (unsigned long)_width*_height*_depth;
        T *ptrd = data(x,y,z);
        for (unsigned int k = cimg::min((unsigned int)vec.size(),_spectrum); k; --k) {
          *ptrd = (T)*(ptrs++); ptrd+=whd;
        }
      }
      return *this;
    }